

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char **ppcVar5;
  ActionType AVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  FeatureType FVar12;
  WebPMuxError WVar13;
  undefined4 uVar14;
  uint32_t nth;
  WebPMuxError WVar15;
  FeatureArg *pFVar16;
  WebPChunk *pWVar17;
  WebPMux *pWVar18;
  void *ptr;
  WebPMux *mux_00;
  ulong extraout_RAX;
  WebPMuxImage *__s1;
  int iVar19;
  char *pcVar20;
  uint uVar21;
  ulong uVar22;
  byte bVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  char *pcVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uint32_t flag;
  WebPMux *local_120;
  WebPMux *mux;
  ulong local_110;
  WebPMux *local_108;
  int dispose_method;
  uint local_fc;
  WebPData chunk;
  undefined8 local_e8;
  uint local_e0;
  WebPChunkId local_dc;
  WebPMuxAnimDispose local_d8;
  WebPMuxAnimBlend local_d4;
  Config config;
  char plus_minus;
  undefined3 uStack_67;
  int nFrames;
  int local_60;
  int unused;
  int parse_error;
  uint uStack_54;
  int local_50;
  int local_48;
  
  config.type_ = NIL_FEATURE;
  config._68_4_ = 0;
  config.args_ = (FeatureArg *)0x0;
  config.input_ = (char *)0x0;
  config.output_ = (char *)0x0;
  config.cmd_args_.own_argv_ = 0;
  config.cmd_args_._36_4_ = 0;
  config.action_type_ = NIL_ACTION;
  config._44_4_ = 0;
  config.cmd_args_.argv_data_.bytes = (uint8_t *)0x0;
  config.cmd_args_.argv_data_.size = 0;
  config.cmd_args_.argc_ = 0;
  config.cmd_args_._4_4_ = 0;
  config.cmd_args_.argv_ = (char **)0x0;
  config.arg_count_ = 0;
  config._84_4_ = 0;
  iVar8 = ExUtilInitCommandLineArguments(argc + -1,argv + 1,&config.cmd_args_);
  if (iVar8 == 0) {
LAB_001043f4:
    PrintHelp();
    uVar24 = 1;
    goto LAB_001048b7;
  }
  iVar8 = config.cmd_args_.argc_;
  lVar25 = (long)config.cmd_args_.argc_;
  iVar19 = 0;
  iVar9 = 0;
  if (lVar25 < 1) {
LAB_00102ed9:
    local_120 = (WebPMux *)CONCAT44(local_120._4_4_,iVar9);
    if (0 < iVar8) {
      lVar26 = 0;
      ppcVar5 = config.cmd_args_.argv_;
      iVar19 = 0;
      do {
        iVar9 = strcmp(ppcVar5[lVar26],"-loop");
        iVar19 = iVar19 + (uint)(iVar9 == 0);
        lVar26 = lVar26 + 1;
      } while (lVar25 != lVar26);
    }
    iVar9 = 0;
    iVar10 = 0;
    if (0 < iVar8) {
      lVar26 = 0;
      ppcVar5 = config.cmd_args_.argv_;
      iVar10 = 0;
      do {
        iVar11 = strcmp(ppcVar5[lVar26],"-bgcolor");
        iVar10 = iVar10 + (uint)(iVar11 == 0);
        lVar26 = lVar26 + 1;
      } while (lVar25 != lVar26);
    }
    if (0 < iVar8) {
      lVar26 = 0;
      ppcVar5 = config.cmd_args_.argv_;
      iVar9 = 0;
      do {
        iVar8 = strcmp(ppcVar5[lVar26],"-duration");
        iVar9 = iVar9 + (uint)(iVar8 == 0);
        lVar26 = lVar26 + 1;
      } while (lVar25 != lVar26);
    }
    if (1 < iVar19) {
      main_cold_4();
      goto LAB_00102ff4;
    }
    if (1 < iVar10) {
      main_cold_3();
      goto LAB_00102ff4;
    }
    if (((WebPMuxError)local_120 == 0) && (0 < iVar10 + iVar19)) {
      main_cold_2();
      goto LAB_00102ff4;
    }
    if ((0 < iVar9) && ((WebPMuxError)local_120 != 0)) {
      main_cold_1();
      goto LAB_00102ff4;
    }
    if (iVar9 < 1) {
      iVar9 = 1;
      if ((WebPMuxError)local_120 != 0) {
        iVar9 = iVar10 + iVar19 + (WebPMuxError)local_120;
      }
    }
    bVar28 = false;
  }
  else {
    lVar26 = 0;
    ppcVar5 = config.cmd_args_.argv_;
    uVar24 = 0;
    do {
      iVar9 = strcmp(ppcVar5[lVar26],"-get");
      uVar24 = uVar24 + (iVar9 == 0);
      lVar26 = lVar26 + 1;
    } while (lVar25 != lVar26);
    if (uVar24 < 2) {
      if (0 < iVar8) {
        lVar26 = 0;
        ppcVar5 = config.cmd_args_.argv_;
        uVar24 = 0;
        do {
          iVar9 = strcmp(ppcVar5[lVar26],"-set");
          uVar24 = uVar24 + (iVar9 == 0);
          lVar26 = lVar26 + 1;
        } while (lVar25 != lVar26);
        if (1 < uVar24) {
          main_cold_8();
          goto LAB_00102ff4;
        }
        if (0 < iVar8) {
          lVar26 = 0;
          ppcVar5 = config.cmd_args_.argv_;
          uVar24 = 0;
          do {
            iVar9 = strcmp(ppcVar5[lVar26],"-strip");
            uVar24 = uVar24 + (iVar9 == 0);
            lVar26 = lVar26 + 1;
          } while (lVar25 != lVar26);
          if (1 < uVar24) {
            main_cold_7();
            goto LAB_00102ff4;
          }
          if (0 < iVar8) {
            lVar26 = 0;
            ppcVar5 = config.cmd_args_.argv_;
            uVar24 = 0;
            do {
              iVar9 = strcmp(ppcVar5[lVar26],"-info");
              uVar24 = uVar24 + (iVar9 == 0);
              lVar26 = lVar26 + 1;
            } while (lVar25 != lVar26);
            if (1 < uVar24) {
              main_cold_6();
              goto LAB_00102ff4;
            }
            if (0 < iVar8) {
              lVar26 = 0;
              ppcVar5 = config.cmd_args_.argv_;
              uVar24 = 0;
              do {
                iVar9 = strcmp(ppcVar5[lVar26],"-o");
                uVar24 = uVar24 + (iVar9 == 0);
                lVar26 = lVar26 + 1;
              } while (lVar25 != lVar26);
              if (1 < uVar24) {
                main_cold_5();
                goto LAB_00102ff4;
              }
              if (0 < iVar8) {
                lVar26 = 0;
                ppcVar5 = config.cmd_args_.argv_;
                iVar9 = 0;
                do {
                  iVar10 = strcmp(ppcVar5[lVar26],"-frame");
                  iVar9 = iVar9 + (uint)(iVar10 == 0);
                  lVar26 = lVar26 + 1;
                } while (lVar25 != lVar26);
                goto LAB_00102ed9;
              }
            }
          }
        }
      }
      iVar9 = 0;
      goto LAB_00102ed9;
    }
    main_cold_9();
LAB_00102ff4:
    bVar28 = true;
    iVar9 = 0;
  }
  if (bVar28) {
    main_cold_60();
    goto LAB_001043f4;
  }
  config.arg_count_ = iVar9;
  pFVar16 = (FeatureArg *)calloc((long)iVar9,0x18);
  config.args_ = pFVar16;
  if (pFVar16 == (FeatureArg *)0x0) {
    main_cold_59();
    goto LAB_001043f4;
  }
  uVar22 = (ulong)(uint)config.cmd_args_.argc_;
  local_120 = (WebPMux *)config.cmd_args_.argv_;
  local_60 = config.cmd_args_.argc_ + -1;
  local_108 = (WebPMux *)((ulong)local_108 & 0xffffffff00000000);
  bVar28 = true;
  iVar8 = 0;
  local_110 = uVar22;
  do {
    iVar19 = (int)uVar22;
    if (iVar19 <= iVar8) break;
    __s1 = (&local_120->images_)[iVar8];
    pFVar16 = config.args_ + (int)local_108;
    if (*(char *)&__s1->header_ == '-') {
      iVar9 = strcmp((char *)__s1,"-set");
      if (iVar9 == 0) {
        if (config.action_type_ == NIL_ACTION) {
          config.action_type_ = ACTION_SET;
          goto LAB_0010353b;
        }
        main_cold_21();
      }
      else {
        iVar9 = strcmp((char *)__s1,"-duration");
        if (iVar9 == 0) {
          if (iVar19 < iVar8 + 2) goto LAB_001035c8;
          if ((config.action_type_ == ACTION_DURATION) || (config.action_type_ == NIL_ACTION)) {
            config.action_type_ = ACTION_DURATION;
            if ((config.type_ == NIL_FEATURE) || (config.type_ == FEATURE_DURATION)) {
              config.type_ = FEATURE_DURATION;
              goto LAB_0010348b;
            }
            main_cold_19();
          }
          else {
            main_cold_20();
          }
        }
        else {
          iVar9 = strcmp((char *)__s1,"-get");
          if (iVar9 == 0) {
            if (config.action_type_ != NIL_ACTION) {
              main_cold_18();
              goto LAB_0010368c;
            }
            config.action_type_ = ACTION_GET;
LAB_0010353b:
            iVar8 = iVar8 + 1;
            bVar29 = true;
            goto LAB_00103543;
          }
          iVar9 = strcmp((char *)__s1,"-strip");
          if (iVar9 == 0) {
            if (config.action_type_ == NIL_ACTION) {
              config.action_type_ = ACTION_STRIP;
              config._80_8_ = config._80_8_ & 0xffffffff00000000;
              goto LAB_0010353b;
            }
            main_cold_17();
          }
          else {
            iVar9 = strcmp((char *)__s1,"-frame");
            if (iVar9 != 0) {
              iVar9 = strcmp((char *)__s1,"-loop");
              if ((iVar9 == 0) || (iVar9 = strcmp((char *)__s1,"-bgcolor"), iVar9 == 0)) {
                if (iVar8 + 2 <= iVar19) {
                  if (((undefined1  [16])config._32_16_ & (undefined1  [16])0xfffffffd) ==
                      (undefined1  [16])0x0) {
                    config.action_type_ = ACTION_SET;
                    if (((undefined1  [16])config._64_16_ & (undefined1  [16])0xfffffffb) ==
                        (undefined1  [16])0x0) {
                      config.type_ = FEATURE_ANMF;
                      iVar19 = strcmp((char *)__s1,"-loop");
                      pFVar16->subtype_ = SUBTYPE_BGCOLOR - (iVar19 == 0);
                      goto LAB_0010348b;
                    }
                    main_cold_13();
                  }
                  else {
                    main_cold_14();
                  }
                  goto LAB_0010368c;
                }
                goto LAB_001035c8;
              }
              iVar9 = strcmp((char *)__s1,"-o");
              if (iVar9 != 0) {
                iVar9 = strcmp((char *)__s1,"-info");
                if (iVar9 != 0) {
                  iVar19 = strcmp((char *)__s1,"-h");
                  if ((iVar19 == 0) || (iVar19 = strcmp((char *)__s1,"-help"), iVar19 == 0)) {
                    PrintHelp();
LAB_00104923:
                    DeleteConfig(&config);
                    exit(0);
                  }
                  iVar19 = strcmp((char *)__s1,"-version");
                  if (iVar19 == 0) {
                    uVar24 = WebPGetMuxVersion();
                    printf("%d.%d.%d\n",(ulong)(uVar24 >> 0x10 & 0xff),(ulong)(uVar24 >> 8 & 0xff),
                           (ulong)(uVar24 & 0xff));
                    goto LAB_00104923;
                  }
                  iVar19 = strcmp((char *)__s1,"--");
                  if (iVar19 == 0) {
                    if (iVar8 < local_60) {
                      iVar8 = iVar8 + 1;
                      if (config.input_ != (char *)0x0) {
                        __s1 = (&local_120->images_)[iVar8];
                        pcVar20 = "ERROR at \'%s\': Multiple input files specified.\n";
                        goto LAB_0010365e;
                      }
                      config.input_ = (char *)(&local_120->images_)[iVar8];
                    }
                    bVar29 = false;
                    goto LAB_00103543;
                  }
                  pcVar20 = "ERROR: Unknown option: \'%s\'.\n";
LAB_0010365e:
                  fprintf(_stderr,pcVar20,__s1);
                  goto LAB_0010368c;
                }
                iVar9 = iVar8 + 2;
                if (iVar19 < iVar9) goto LAB_001035c8;
                if (iVar19 <= iVar9) {
                  if (config.action_type_ != NIL_ACTION) {
                    main_cold_12();
                    goto LAB_0010368c;
                  }
                  config.action_type_ = ACTION_INFO;
                  config._80_8_ = config._80_8_ & 0xffffffff00000000;
                  config.input_ = (char *)(&local_120->iccp_)[iVar8];
                  iVar8 = iVar9;
                  goto LAB_0010349d;
                }
                pcVar20 = "ERROR: Too many arguments for \'%s\'.\n";
                goto LAB_001035dc;
              }
              if (iVar19 < iVar8 + 2) goto LAB_001035c8;
              config.output_ = (char *)(&local_120->iccp_)[iVar8];
              iVar8 = iVar8 + 2;
              goto LAB_0010349d;
            }
            iVar9 = iVar8 + 3;
            if (iVar19 < iVar9) {
LAB_001035c8:
              pcVar20 = "ERROR: Too few arguments for \'%s\'.\n";
LAB_001035dc:
              bVar29 = false;
              fprintf(_stderr,pcVar20,__s1);
              goto LAB_00103543;
            }
            if (((undefined1  [16])config._32_16_ & (undefined1  [16])0xfffffffd) ==
                (undefined1  [16])0x0) {
              config.action_type_ = ACTION_SET;
              if (((undefined1  [16])config._64_16_ & (undefined1  [16])0xfffffffb) ==
                  (undefined1  [16])0x0) {
                config.type_ = FEATURE_ANMF;
                pFVar16->subtype_ = SUBTYPE_ANMF;
                pFVar16->filename_ = (char *)(&local_120->iccp_)[iVar8];
                pWVar17 = (&local_120->exif_)[iVar8];
                goto LAB_00103495;
              }
              main_cold_15();
            }
            else {
              main_cold_16();
            }
          }
        }
      }
LAB_0010368c:
      bVar28 = false;
      bVar29 = false;
    }
    else {
      AVar6 = config.action_type_;
      if (config.action_type_ == NIL_ACTION) {
        main_cold_11();
LAB_0010350b:
        bVar28 = false;
        bVar29 = false;
        uVar22 = local_110;
      }
      else {
        iVar19 = strcmp((char *)__s1,"icc");
        if (((iVar19 == 0) || (iVar9 = strcmp((char *)__s1,"exif"), iVar9 == 0)) ||
           (iVar9 = strcmp((char *)__s1,"xmp"), iVar9 == 0)) {
          if (config.type_ != NIL_FEATURE) {
            main_cold_10();
            goto LAB_0010350b;
          }
          if (iVar19 == 0) {
            FVar12 = FEATURE_ICCP;
          }
          else {
            iVar19 = strcmp((char *)__s1,"exif");
            FVar12 = FEATURE_XMP - (iVar19 == 0);
          }
          config.type_ = FVar12;
          uVar22 = local_110;
          if (AVar6 != ACTION_SET) {
            iVar8 = iVar8 + 1;
            bVar29 = true;
            goto LAB_00103543;
          }
          if ((int)local_110 < iVar8 + 2) goto LAB_001035c8;
          pFVar16->filename_ = (char *)(&local_120->iccp_)[iVar8];
          iVar8 = iVar8 + 2;
        }
        else {
          iVar19 = strcmp((char *)__s1,"frame");
          if ((AVar6 == ACTION_GET) && (iVar19 == 0)) {
            uVar22 = local_110;
            if ((int)local_110 < iVar8 + 2) goto LAB_001035c8;
            config.type_ = FEATURE_ANMF;
          }
          else {
            iVar19 = strcmp((char *)__s1,"loop");
            if ((AVar6 == ACTION_SET) && (iVar19 == 0)) {
              uVar22 = local_110;
              if ((int)local_110 < iVar8 + 2) goto LAB_001035c8;
              config.type_ = FEATURE_LOOP;
            }
            else {
              iVar19 = strcmp((char *)__s1,"bgcolor");
              uVar22 = local_110;
              if ((AVar6 != ACTION_SET) || (iVar19 != 0)) {
                if (config.input_ != (char *)0x0) {
                  pcVar20 = "ERROR at \'%s\': Multiple input files specified.\n";
                  goto LAB_0010365e;
                }
                config.input_ = (char *)__s1;
                goto LAB_0010353b;
              }
              if ((int)local_110 < iVar8 + 2) goto LAB_001035c8;
              config.type_ = FEATURE_BGCOLOR;
            }
          }
LAB_0010348b:
          iVar9 = iVar8 + 2;
          pWVar17 = (&local_120->iccp_)[iVar8];
LAB_00103495:
          pFVar16->params_ = (char *)pWVar17;
          iVar8 = iVar9;
        }
        local_108 = (WebPMux *)CONCAT44(local_108._4_4_,(int)local_108 + 1);
LAB_0010349d:
        bVar29 = true;
      }
    }
LAB_00103543:
  } while (bVar29);
  if (!bVar28) {
LAB_001043ef:
    main_cold_58();
    goto LAB_001043f4;
  }
  if (config.action_type_ == NIL_ACTION) {
    main_cold_57();
    goto LAB_001043ef;
  }
  if (config.action_type_ != ACTION_INFO && config.type_ == NIL_FEATURE) {
    main_cold_22();
    goto LAB_001043ef;
  }
  if (config.input_ == (char *)0x0) {
    if (config.action_type_ == ACTION_SET) {
      if (config.type_ == FEATURE_ANMF) goto LAB_0010370c;
      main_cold_24();
    }
    else {
      main_cold_23();
    }
    goto LAB_001043ef;
  }
LAB_0010370c:
  if ((config.action_type_ != ACTION_INFO) && (config.output_ == (char *)0x0)) {
    main_cold_25();
    goto LAB_001043ef;
  }
  mux = (WebPMux *)0x0;
  uVar21 = 1;
  switch(config.action_type_) {
  case ACTION_GET:
    iVar8 = CreateMux(config.input_,&mux);
    pWVar18 = mux;
    uVar21 = 0;
    if (iVar8 != 0) {
      if (config.type_ - FEATURE_EXIF < 3) {
        WVar13 = WebPMuxGetChunk(mux,kFourccList[config.type_],&chunk);
        if (WVar13 == WEBP_MUX_OK) {
          uVar21 = WriteData(config.output_,&chunk);
        }
        else {
          main_cold_51();
        }
      }
      else if (config.type_ == FEATURE_ANMF) {
        _parse_error = (WebPMuxAnimParams)((ulong)_parse_error & 0xffffffff00000000);
        chunk.bytes = (uint8_t *)0x0;
        chunk.size = 0;
        nth = ExUtilGetInt((config.args_)->params_,10,&parse_error);
        if ((int)nth < 0) {
          main_cold_55();
          goto LAB_00104874;
        }
        mux_00 = (WebPMux *)0x0;
        if (parse_error == 0) {
          WVar15 = WebPMuxGetFrame(pWVar18,nth,(WebPMuxFrameInfo *)&chunk);
          WVar13 = WEBP_MUX_NOT_FOUND;
          if (local_dc == WEBP_CHUNK_ANMF) {
            WVar13 = WVar15;
          }
          if (WVar15 != WEBP_MUX_OK) {
            WVar13 = WVar15;
          }
          if (WVar13 == WEBP_MUX_OK) {
            mux_00 = WebPNewInternal(0x108);
            if (mux_00 == (WebPMux *)0x0) {
              main_cold_54();
              goto LAB_00104874;
            }
            WVar13 = WebPMuxSetImage(mux_00,&chunk,1);
            if (WVar13 == WEBP_MUX_OK) {
              iVar8 = WriteWebP(mux_00,config.output_);
              bVar28 = iVar8 != 0;
              goto LAB_00104879;
            }
            main_cold_53();
          }
          else {
            main_cold_52();
LAB_00104874:
            mux_00 = (WebPMux *)0x0;
          }
          bVar28 = false;
        }
        else {
          bVar28 = true;
        }
LAB_00104879:
        WebPFree(chunk.bytes);
        chunk.bytes = (uint8_t *)0x0;
        chunk.size = 0;
        WebPMuxDelete(mux_00);
        uVar21 = (uint)(byte)(parse_error == 0 & bVar28);
      }
      else {
        main_cold_56();
      }
    }
    break;
  case ACTION_SET:
    switch(config.type_) {
    case FEATURE_EXIF:
    case FEATURE_XMP:
    case FEATURE_ICCP:
      iVar8 = CreateMux(config.input_,&mux);
      uVar21 = 0;
      if (iVar8 == 0) goto switchD_0010374e_caseD_5;
      iVar8 = ExUtilReadFileToWebPData((config.args_)->filename_,&chunk);
      if (iVar8 == 0) goto switchD_0010374e_caseD_5;
      WVar13 = WebPMuxSetChunk(mux,kFourccList[config.type_],&chunk,1);
      WebPFree(chunk.bytes);
      chunk.bytes = (uint8_t *)0x0;
      chunk.size = 0;
      if (WVar13 != WEBP_MUX_OK) {
        main_cold_42();
        goto switchD_0010374e_caseD_5;
      }
      goto LAB_00104557;
    case FEATURE_ANMF:
      parse_error = 0xffffffff;
      uStack_54 = 0;
      local_120 = WebPNewInternal(0x108);
      mux = local_120;
      if (local_120 == (WebPMux *)0x0) {
        main_cold_49();
LAB_0010482c:
        uVar21 = 0;
        iVar8 = 3;
      }
      else {
        if (config.arg_count_ < 1) {
          uVar21 = 1;
        }
        else {
          lVar26 = 0x10;
          lVar25 = 0;
          do {
            iVar8 = *(int *)((long)config.args_ + lVar26 + -0x10);
            if (iVar8 == 1) {
              local_dc = WEBP_CHUNK_ANMF;
              iVar19 = ExUtilReadFileToWebPData(*(char **)((long)config.args_ + lVar26 + -8),&chunk)
              ;
              iVar8 = 3;
              if (iVar19 != 0) {
                uVar14 = __isoc99_sscanf(*(undefined8 *)((long)&(config.args_)->subtype_ + lVar26),
                                         "+%d+%d+%d+%d%c%c+%d",&local_e0,&local_e8,
                                         (long)&local_e8 + 4,&dispose_method,&plus_minus,&flag,
                                         &unused);
                bVar28 = true;
                uVar21 = 0;
                switch(uVar14) {
                case 1:
                  local_e8 = 0;
                case 3:
                  dispose_method = 0;
                case 4:
                  _plus_minus = CONCAT31(uStack_67,0x2b);
                  flag = CONCAT31(flag._1_3_,0x62);
                case 6:
                  if (((local_e8._4_4_ | (uint)local_e8) & 1) != 0) {
                    fprintf(_stderr,
                            "Warning: odd offsets will be snapped to even values (%d, %d) -> (%d, %d)\n"
                            ,local_e8 & 0xffffffff,(ulong)local_e8._4_4_,
                            (ulong)((uint)local_e8 & 0xfffffffe),
                            (ulong)(local_e8._4_4_ & 0xfffffffe));
                  }
                  local_d8 = dispose_method;
                  if ((char)flag == 'b') {
                    if (((_plus_minus & 0xff) == 0x2d) || (uVar21 = 0, (_plus_minus & 0xff) == 0x2b)
                       ) {
                      local_d4 = (WebPMuxAnimBlend)(plus_minus != '+');
                      uVar21 = 1;
                      bVar28 = false;
                    }
                  }
                }
                if (bVar28) {
                  main_cold_44();
                }
                else {
                  WVar13 = WebPMuxPushFrame(local_120,(WebPMuxFrameInfo *)&chunk,1);
                  WebPFree(chunk.bytes);
                  chunk.bytes = (uint8_t *)0x0;
                  chunk.size = 0;
                  if (WVar13 == WEBP_MUX_OK) {
                    iVar8 = 0xf;
                    bVar28 = true;
                    goto LAB_00104290;
                  }
                  main_cold_43();
                }
              }
              bVar28 = false;
              uVar21 = 0;
LAB_00104290:
              uVar24 = uVar21;
              if (!bVar28) goto LAB_00104545;
            }
            else {
              if (iVar8 == 2) {
                auVar2._12_4_ = 0;
                auVar2._0_12_ = (undefined1  [12])chunk._4_12_;
                chunk = (WebPData)(auVar2 << 0x20);
                uVar24 = ExUtilGetInt(*(char **)((long)&(config.args_)->subtype_ + lVar26),10,
                                      (int *)&chunk);
                if (uVar24 < 0x10000) {
                  bVar29 = (uint32_t)chunk.bytes == 0;
                  if (bVar29) {
                    uStack_54 = uVar24;
                    iVar8 = 0xf;
                    bVar28 = true;
                    bVar29 = true;
                  }
                  else {
                    bVar28 = false;
                    iVar8 = 3;
                  }
                }
                else {
                  main_cold_45();
                  iVar8 = 3;
                  bVar28 = false;
                  bVar29 = false;
                }
                uVar21 = (uint)bVar29;
                goto LAB_00104290;
              }
              if (iVar8 != 3) {
                main_cold_48();
                goto LAB_0010482c;
              }
              iVar19 = ParseBgcolorArgs(*(char **)((long)&(config.args_)->subtype_ + lVar26),
                                        (uint32_t *)&chunk);
              if (iVar19 == 0) {
                main_cold_46();
                iVar8 = 3;
              }
              else {
                parse_error = (uint32_t)chunk.bytes;
                iVar8 = 0xf;
              }
              bVar28 = iVar19 != 0;
              uVar21 = (uint)bVar28;
              uVar24 = (uint)bVar28;
              if (iVar19 == 0) goto LAB_00104545;
            }
            lVar25 = lVar25 + 1;
            lVar26 = lVar26 + 0x18;
            uVar21 = uVar24;
          } while (lVar25 < config.arg_count_);
        }
        WVar13 = WebPMuxSetAnimationParams(local_120,(WebPMuxAnimParams *)&parse_error);
        iVar8 = 9;
        if (WVar13 != WEBP_MUX_OK) {
          main_cold_47();
          goto LAB_0010482c;
        }
      }
LAB_00104545:
      if (iVar8 == 3) goto switchD_0010374e_caseD_5;
      goto joined_r0x00104024;
    default:
      main_cold_50();
LAB_001047c4:
      uVar21 = 0;
      goto switchD_0010374e_caseD_5;
    case FEATURE_LOOP:
      chunk.bytes = &DAT_ffffffff;
      _parse_error = (WebPMuxAnimParams)((ulong)_parse_error & 0xffffffff00000000);
      uVar24 = ExUtilGetInt((config.args_)->params_,10,&parse_error);
      if ((uVar24 < 0x10000) && (parse_error == 0)) {
        iVar19 = CreateMux(config.input_,&mux);
        pWVar18 = mux;
        uVar21 = 0;
        iVar8 = 3;
        if (iVar19 != 0) {
          WVar13 = WebPMuxGetAnimationParams(mux,(WebPMuxAnimParams *)&chunk);
          if (WVar13 == WEBP_MUX_OK) {
            chunk.bytes._4_4_ = uVar24;
            WVar13 = WebPMuxSetAnimationParams(pWVar18,(WebPMuxAnimParams *)&chunk);
            if (WVar13 == WEBP_MUX_OK) {
              uVar21 = 1;
              iVar8 = 9;
            }
            else {
              main_cold_40();
            }
          }
          else {
            main_cold_39();
          }
        }
      }
      else {
        main_cold_41();
        uVar21 = 0;
        iVar8 = 3;
      }
      break;
    case FEATURE_BGCOLOR:
      chunk.bytes = &DAT_ffffffff;
      iVar8 = ParseBgcolorArgs((config.args_)->params_,(uint32_t *)&parse_error);
      if (iVar8 == 0) {
        main_cold_38();
        uVar21 = 0;
        iVar8 = 3;
      }
      else {
        iVar19 = CreateMux(config.input_,&mux);
        pWVar18 = mux;
        uVar21 = 0;
        iVar8 = 3;
        if (iVar19 != 0) {
          WVar13 = WebPMuxGetAnimationParams(mux,(WebPMuxAnimParams *)&chunk);
          if (WVar13 == WEBP_MUX_OK) {
            chunk.bytes._0_4_ = parse_error;
            WVar13 = WebPMuxSetAnimationParams(pWVar18,(WebPMuxAnimParams *)&chunk);
            if (WVar13 == WEBP_MUX_OK) {
              uVar21 = 1;
              iVar8 = 9;
            }
            else {
              main_cold_37();
            }
          }
          else {
            main_cold_36();
          }
        }
      }
    }
    if (iVar8 != 3) {
joined_r0x00104024:
      if (iVar8 != 9) {
        uVar24 = 0;
        goto LAB_001048b7;
      }
LAB_00104557:
      pWVar18 = mux;
      goto LAB_00104564;
    }
    break;
  case ACTION_STRIP:
    iVar8 = CreateMux(config.input_,&mux);
    pWVar18 = mux;
    uVar21 = 0;
    if (iVar8 == 0) break;
    if (2 < config.type_ - FEATURE_EXIF) {
      main_cold_29();
      break;
    }
    WVar13 = WebPMuxDeleteChunk(mux,kFourccList[config.type_]);
    if (WVar13 != WEBP_MUX_OK) {
      main_cold_30();
      break;
    }
LAB_00104564:
    uVar21 = WriteWebP(pWVar18,config.output_);
    break;
  case ACTION_INFO:
    iVar8 = CreateMux(config.input_,&mux);
    pWVar18 = mux;
    if (iVar8 == 0) goto LAB_001047c4;
    WebPMuxGetCanvasSize(mux,&unused,(int *)&plus_minus);
    printf("Canvas size: %d x %d\n",(ulong)(uint)unused,(ulong)_plus_minus);
    WVar13 = WebPMuxGetFeatures(pWVar18,&flag);
    if (WVar13 == WEBP_MUX_OK) {
      if (flag == 0) {
        puts("No features present.");
      }
      else {
        printf("Features present:");
        if ((flag & 2) != 0) {
          printf(" animation");
        }
        if ((flag & 0x20) != 0) {
          printf(" ICC profile");
        }
        if ((flag & 8) != 0) {
          printf(" EXIF metadata");
        }
        if ((flag & 4) != 0) {
          printf(" XMP metadata");
        }
        if ((flag & 0x10) != 0) {
          printf(" transparency");
        }
        putchar(10);
        if ((flag & 2) != 0) {
          WebPMuxGetAnimationParams(pWVar18,(WebPMuxAnimParams *)&dispose_method);
          printf("Background color : 0x%.8X  Loop Count : %d\n",(ulong)(uint)dispose_method,
                 (ulong)local_fc);
          WebPMuxNumChunks(pWVar18,WEBP_CHUNK_ANMF,&nFrames);
          printf("Number of %ss: %d\n","frame",(ulong)(uint)nFrames);
          if (nFrames < 1) {
            bVar28 = true;
          }
          else {
            printf("No.: width height alpha x_offset y_offset ");
            printf("duration   dispose blend ");
            puts("image_size  compression");
            bVar28 = nFrames < 1;
            if (0 < nFrames) {
              bVar28 = false;
              uVar24 = 1;
              do {
                WVar13 = WebPMuxGetFrame(pWVar18,uVar24,(WebPMuxFrameInfo *)&chunk);
                if (WVar13 == WEBP_MUX_OK) {
                  WebPGetFeaturesInternal
                            (chunk.bytes,chunk.size,(WebPBitstreamFeatures *)&parse_error,0x209);
                  pcVar20 = "yes";
                  pcVar27 = "no";
                  if (local_50 == 0) {
                    pcVar20 = "no";
                  }
                  printf("%3d: %5d %5d %5s %8d %8d ",(ulong)uVar24,(ulong)_parse_error & 0xffffffff,
                         (ulong)_parse_error >> 0x20,pcVar20,local_e8 & 0xffffffff,local_e8 >> 0x20)
                  ;
                  pcVar20 = "background";
                  if (local_d8 == WEBP_MUX_DISPOSE_NONE) {
                    pcVar20 = "none";
                  }
                  if (local_d4 == WEBP_MUX_BLEND) {
                    pcVar27 = "yes";
                  }
                  printf("%8d %10s %5s ",(ulong)local_e0,pcVar20,pcVar27);
                  pcVar20 = "undefined";
                  if (local_48 == 2) {
                    pcVar20 = "lossless";
                  }
                  if (local_48 == 1) {
                    pcVar20 = "lossy";
                  }
                  printf("%10d %11s\n",(ulong)(uint)chunk.size,pcVar20);
                  WebPFree(chunk.bytes);
                  chunk.bytes = (uint8_t *)0x0;
                  chunk.size = 0;
                }
                else {
                  main_cold_27();
                  local_120 = (WebPMux *)CONCAT44(local_120._4_4_,WVar13);
                }
                if (WVar13 != WEBP_MUX_OK) break;
                bVar28 = nFrames <= (int)uVar24;
                bVar29 = (int)uVar24 < nFrames;
                uVar24 = uVar24 + 1;
              } while (bVar29);
            }
          }
          WVar13 = (WebPMuxError)local_120;
          if (!bVar28) goto LAB_00104511;
        }
        if ((flag & 0x20) != 0) {
          WebPMuxGetChunk(pWVar18,"ICCP",&chunk);
          printf("Size of the ICC profile data: %d\n",(ulong)(uint)chunk.size);
        }
        if ((flag & 8) != 0) {
          WebPMuxGetChunk(pWVar18,"EXIF",&chunk);
          printf("Size of the EXIF metadata: %d\n",(ulong)(uint)chunk.size);
        }
        if ((flag & 4) != 0) {
          WebPMuxGetChunk(pWVar18,"XMP ",&chunk);
          printf("Size of the XMP metadata: %d\n",(ulong)(uint)chunk.size);
        }
        if ((flag & 0x12) == 0x10) {
          WVar13 = WebPMuxGetFrame(pWVar18,1,(WebPMuxFrameInfo *)&chunk);
          if (WVar13 != WEBP_MUX_OK) {
            main_cold_28();
            goto LAB_00104511;
          }
          printf("Size of the image (with alpha): %d\n",(ulong)(uint)chunk.size);
          WebPFree(chunk.bytes);
          chunk.bytes = (uint8_t *)0x0;
          chunk.size = 0;
        }
      }
      WVar13 = WEBP_MUX_OK;
    }
    else {
      main_cold_26();
    }
LAB_00104511:
    uVar21 = (uint)(WVar13 == WEBP_MUX_OK);
    break;
  case ACTION_DURATION:
    iVar8 = CreateMux(config.input_,&mux);
    uVar24 = 0;
    if (iVar8 == 0) {
LAB_00103cfe:
      bVar23 = 3;
      uVar21 = 0;
    }
    else {
      bVar23 = 3;
      local_120 = mux;
      WVar13 = WebPMuxNumChunks(mux,WEBP_CHUNK_ANMF,&dispose_method);
      bVar28 = WVar13 == WEBP_MUX_OK;
      uVar21 = (uint)bVar28;
      if (!bVar28) {
        main_cold_31();
        goto LAB_00103cfe;
      }
      if (dispose_method == 0) {
        main_cold_35();
        uVar21 = 0;
        uVar7 = 1;
        if ((extraout_RAX & 1) == 0) goto LAB_0010473a;
      }
      else {
        pWVar18 = WebPNewInternal(0x108);
        if (pWVar18 == (WebPMux *)0x0) {
LAB_00103d29:
          pWVar18 = (WebPMux *)0x0;
        }
        else {
          WVar13 = WebPMuxGetAnimationParams(local_120,(WebPMuxAnimParams *)&parse_error);
          if ((WVar13 == WEBP_MUX_OK) &&
             (WVar13 = WebPMuxSetAnimationParams(pWVar18,(WebPMuxAnimParams *)&parse_error),
             WVar13 != WEBP_MUX_OK)) {
            main_cold_32();
            uVar21 = (uint)bVar28;
LAB_00103d21:
            WebPMuxDelete(pWVar18);
            goto LAB_00103d29;
          }
          local_110 = CONCAT71(local_110._1_7_,bVar28);
          local_108 = (WebPMux *)CONCAT44(local_108._4_4_,1);
          lVar25 = 0;
          do {
            pcVar20 = kFourccList[lVar25 + 1];
            WVar13 = WebPMuxGetChunk(local_120,pcVar20,&chunk);
            bVar28 = false;
            if ((WVar13 == WEBP_MUX_OK) && (chunk.size != 0)) {
              WVar13 = WebPMuxSetChunk(pWVar18,pcVar20,&chunk,1);
              bVar28 = false;
              if (WVar13 != WEBP_MUX_OK) {
                main_cold_33();
                bVar28 = true;
                local_108 = (WebPMux *)((ulong)local_108 & 0xffffffff00000000);
              }
            }
          } while ((!bVar28) && (bVar28 = lVar25 != 2, lVar25 = lVar25 + 1, bVar28));
          uVar21 = (uint)local_110 & 0xff;
          if ((int)local_108 == 0) goto LAB_00103d21;
        }
        bVar23 = 3;
        if (pWVar18 != (WebPMux *)0x0) {
          local_110 = CONCAT44(local_110._4_4_,uVar21);
          ptr = WebPMalloc((long)dispose_method << 2);
          if (ptr == (void *)0x0) {
LAB_0010472d:
            uVar21 = (uint)local_110;
          }
          else {
            if (0 < dispose_method) {
              lVar25 = 0;
              do {
                *(undefined4 *)((long)ptr + lVar25 * 4) = 0xffffffff;
                lVar25 = lVar25 + 1;
              } while (lVar25 < dispose_method);
            }
            if (0 < config.arg_count_) {
              lVar25 = 0;
              do {
                iVar8 = ExUtilGetInts(config.args_[lVar25].params_,10,3,(int *)&chunk);
                auVar4 = _DAT_0012a030;
                auVar3 = _DAT_0012a020;
                auVar2 = _DAT_0012a010;
                bVar23 = 0x34;
                bVar28 = 0 < iVar8;
                if (0 < iVar8) {
                  if ((int)(uint32_t)chunk.bytes < 0) {
                    main_cold_34();
                    bVar28 = false;
                  }
                  else {
                    iVar19 = dispose_method;
                    if (iVar8 == 1) {
                      iVar9 = 1;
                    }
                    else {
                      iVar9 = dispose_method;
                      if ((int)chunk.bytes._4_4_ < dispose_method) {
                        iVar9 = chunk.bytes._4_4_;
                      }
                      if ((int)chunk.bytes._4_4_ < 1) {
                        iVar9 = 1;
                      }
                      iVar10 = iVar9;
                      if (2 < iVar8) {
                        iVar10 = (uint)chunk.size;
                      }
                      if (iVar10 < dispose_method) {
                        iVar19 = iVar10;
                      }
                      if (iVar10 == 0) {
                        iVar19 = dispose_method;
                      }
                    }
                    bVar28 = true;
                    uVar21 = iVar19 - iVar9;
                    bVar23 = 0;
                    if (iVar9 <= iVar19) {
                      auVar30._4_4_ = 0;
                      auVar30._0_4_ = uVar21;
                      auVar30._8_4_ = uVar21;
                      auVar30._12_4_ = 0;
                      auVar30 = auVar30 ^ _DAT_0012a030;
                      uVar22 = 0;
                      do {
                        auVar31._8_4_ = (int)uVar22;
                        auVar31._0_8_ = uVar22;
                        auVar31._12_4_ = (int)(uVar22 >> 0x20);
                        auVar32 = (auVar31 | auVar3) ^ auVar4;
                        iVar8 = auVar30._4_4_;
                        if ((bool)(~(iVar8 < auVar32._4_4_ ||
                                    auVar30._0_4_ < auVar32._0_4_ && auVar32._4_4_ == iVar8) & 1)) {
                          *(uint32_t *)((long)ptr + uVar22 * 4 + (long)iVar9 * 4 + -4) =
                               (uint32_t)chunk.bytes;
                        }
                        if (auVar32._12_4_ <= auVar30._12_4_ &&
                            (auVar32._8_4_ <= auVar30._8_4_ || auVar32._12_4_ != auVar30._12_4_)) {
                          *(uint32_t *)((long)ptr + uVar22 * 4 + (long)iVar9 * 4) =
                               (uint32_t)chunk.bytes;
                        }
                        auVar31 = (auVar31 | auVar2) ^ auVar4;
                        iVar19 = auVar31._4_4_;
                        if (iVar19 <= iVar8 && (iVar19 != iVar8 || auVar31._0_4_ <= auVar30._0_4_))
                        {
                          *(uint32_t *)((long)ptr + uVar22 * 4 + (long)iVar9 * 4 + 4) =
                               (uint32_t)chunk.bytes;
                          *(uint32_t *)((long)ptr + uVar22 * 4 + (long)iVar9 * 4 + 8) =
                               (uint32_t)chunk.bytes;
                        }
                        uVar22 = uVar22 + 4;
                        bVar23 = 0;
                      } while (((ulong)uVar21 + 4 & 0xfffffffffffffffc) != uVar22);
                    }
                  }
                }
                if (bVar23 != 0) {
                  if (bVar23 == 0x34) {
                    uVar21 = (uint)bVar28;
                    goto LAB_00104708;
                  }
                  uVar21 = (uint)bVar28;
                  goto LAB_00104732;
                }
                lVar25 = lVar25 + 1;
              } while (lVar25 < config.arg_count_);
              local_110 = CONCAT44(local_110._4_4_,(uint)bVar28);
            }
            local_108 = pWVar18;
            if (0 < dispose_method) {
              uVar22 = 0;
              do {
                uVar1 = uVar22 + 1;
                WVar13 = WebPMuxGetFrame(local_120,(uint32_t)uVar1,(WebPMuxFrameInfo *)&chunk);
                if ((WVar13 == WEBP_MUX_OK) && (local_dc == WEBP_CHUNK_ANMF)) {
                  uVar21 = *(uint *)((long)ptr + uVar22 * 4);
                  if (-1 < (int)uVar21) {
                    local_e0 = uVar21;
                  }
                  WVar13 = WebPMuxPushFrame(local_108,(WebPMuxFrameInfo *)&chunk,1);
                  if (WVar13 != WEBP_MUX_OK) {
                    pcVar20 = "ERROR: error push frame data #%d\n";
                    goto LAB_001046bd;
                  }
                  WebPFree(chunk.bytes);
                  chunk.bytes = (uint8_t *)0x0;
                  chunk.size = 0;
                  bVar23 = 0;
                }
                else {
                  pcVar20 = "ERROR: can not retrieve frame #%d.\n";
LAB_001046bd:
                  local_110 = local_110 & 0xffffffff00000000;
                  fprintf(_stderr,pcVar20,uVar1 & 0xffffffff);
                  bVar23 = 0x34;
                }
                if (bVar23 != 0) {
                  if (bVar23 != 0x34) goto LAB_0010472d;
                  pWVar18 = local_108;
                  uVar21 = (uint)local_110;
                  goto LAB_00104708;
                }
                uVar22 = uVar1;
              } while ((long)uVar1 < (long)dispose_method);
            }
            WebPMuxDelete(local_120);
            pWVar18 = local_108;
            uVar21 = WriteWebP(local_108,config.output_);
            mux = pWVar18;
            pWVar18 = (WebPMux *)0x0;
LAB_00104708:
            WebPFree(ptr);
            WebPMuxDelete(pWVar18);
            bVar23 = (uVar21 == 0) * '\x03';
            uVar21 = (uint)(uVar21 != 0);
          }
        }
LAB_00104732:
        uVar7 = uVar21;
        if (bVar23 == 0) {
LAB_0010473a:
          uVar21 = uVar7;
          bVar23 = 2;
        }
      }
    }
    if ((bVar23 & 0xfe) != 2) goto LAB_001048b7;
  }
switchD_0010374e_caseD_5:
  WebPMuxDelete(mux);
  uVar24 = (uint)(uVar21 == 0);
LAB_001048b7:
  free(config.args_);
  ExUtilDeleteCommandLineArguments(&config.cmd_args_);
  return uVar24;
}

Assistant:

int main(int argc, const char* argv[]) {
  Config config;
  int ok;

  INIT_WARGV(argc, argv);

  ok = InitializeConfig(argc - 1, argv + 1, &config, GET_WARGV_OR_NULL());
  if (ok) {
    ok = Process(&config);
  } else {
    PrintHelp();
  }
  DeleteConfig(&config);
  FREE_WARGV_AND_RETURN(!ok);
}